

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackTypeValidator::validateBuiltinVariable
          (TransformFeedbackTypeValidator *this,string *resource,GLint propValue,
          string *implementationName)

{
  TestContext *this_00;
  int iVar1;
  DataType DVar2;
  char *pcVar3;
  size_t sVar4;
  DataType DVar5;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  TestLog local_198 [13];
  ios_base local_130 [264];
  
  iVar1 = std::__cxx11::string::compare((char *)resource);
  local_1a8 = (undefined1  [8])
              ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx)->
              m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Verifying type, expecting ",0x1a);
  DVar5 = (uint)(iVar1 == 0) * 4;
  pcVar3 = glu::getDataTypeName(DVar5);
  iVar1 = (int)(ostringstream *)&local_1a0;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)local_1a0[-3]);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar3,sVar4);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  DVar2 = glu::getDataTypeFromGLType(propValue);
  if (DVar2 != DVar5) {
    local_1a8 = (undefined1  [8])
                ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx)->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\tError, got ",0xc);
    DVar5 = glu::getDataTypeFromGLType(propValue);
    pcVar3 = glu::getDataTypeName(DVar5);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a0[-3]);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar3,sVar4);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"resource type invalid","");
    this_00 = (this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx;
    if (this_00->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1a8);
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,(ulong)((long)&(local_198[0].m_log)->flags + 1));
    }
  }
  return;
}

Assistant:

void TransformFeedbackTypeValidator::validateBuiltinVariable (const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(implementationName);

	glu::DataType varType = glu::TYPE_INVALID;

	if (resource == "gl_Position")
		varType = glu::TYPE_FLOAT_VEC4;
	else
		DE_ASSERT(false);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying type, expecting " << glu::getDataTypeName(varType) << tcu::TestLog::EndMessage;
	if (glu::getDataTypeFromGLType(propValue) != varType)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << glu::getDataTypeName(glu::getDataTypeFromGLType(propValue)) << tcu::TestLog::EndMessage;
		setError("resource type invalid");
	}
	return;
}